

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>::
     Combine<duckdb::ArgMinMaxState<duckdb::date_t,duckdb::hugeint_t>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (ArgMinMaxState<duckdb::date_t,_duckdb::hugeint_t> *source,
               ArgMinMaxState<duckdb::date_t,_duckdb::hugeint_t> *target,AggregateInputData *param_3
               )

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  
  if ((source->super_ArgMinMaxStateBase).is_initialized != true) {
    return;
  }
  if ((target->super_ArgMinMaxStateBase).is_initialized == false) {
    uVar2 = (source->value).lower;
    lVar3 = (source->value).upper;
  }
  else {
    uVar2 = (source->value).lower;
    lVar3 = (source->value).upper;
    lVar1 = (target->value).upper;
    if ((lVar3 <= lVar1) && (uVar2 <= (target->value).lower || lVar3 != lVar1)) {
      return;
    }
  }
  (target->arg).days = (source->arg).days;
  (target->value).lower = uVar2;
  (target->value).upper = lVar3;
  (target->super_ArgMinMaxStateBase).is_initialized = true;
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_initialized) {
			return;
		}
		if (!target.is_initialized || COMPARATOR::Operation(source.value, target.value)) {
			Assign(target, source.arg, source.value, source.arg_null);
			target.is_initialized = true;
		}
	}